

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

_Bool copy_active_tensor_to_branches
                (TENSOR *layer_active_tensor,CNN_LAYER_CONFIG *layer_config,int branch,
                TENSOR *branch_output)

{
  _Bool _Var1;
  TENSOR *src;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int copy_channels;
  int b;
  CNN_BRANCH_CONFIG *branch_config;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int channels;
  int dst_offset;
  int copy_channels_00;
  
  src = (TENSOR *)(in_RSI + 0x40);
  copy_channels_00 = 0;
  do {
    if (3 < copy_channels_00) {
      return true;
    }
    if (((src->allocsize & 1 << ((byte)copy_channels_00 & 0x1f)) != 0) &&
       (copy_channels_00 != in_EDX)) {
      if (src->channels < 1) {
        channels = *(int *)(in_RDI + 4);
      }
      else {
        channels = src->channels;
      }
      dst_offset = channels;
      _Var1 = realloc_tensor((TENSOR *)CONCAT44(copy_channels_00,channels),channels,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (!_Var1) {
        return false;
      }
      copy_tensor(src,copy_channels_00,dst_offset,
                  (TENSOR *)CONCAT44(channels,in_stack_ffffffffffffffc0));
    }
    copy_channels_00 = copy_channels_00 + 1;
  } while( true );
}

Assistant:

static bool copy_active_tensor_to_branches(const TENSOR *layer_active_tensor,
                                           const CNN_LAYER_CONFIG *layer_config,
                                           int branch, TENSOR branch_output[]) {
  const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
      // Copy layer's active tensor to output tensor of branch b if set in
      // mask. The output becomes the input of the first layer of the branch
      // because the layer of the branch is not the first layer.
      int copy_channels = branch_config->channels_to_copy > 0
                              ? branch_config->channels_to_copy
                              : layer_active_tensor->channels;
      if (!realloc_tensor(&branch_output[b], copy_channels,
                          layer_active_tensor->width,
                          layer_active_tensor->height)) {
        return false;
      }
      copy_tensor(layer_active_tensor, copy_channels, 0, &branch_output[b]);
    }
  }
  return true;
}